

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aas_test.cc
# Opt level: O0

int test_create_access_key_for_account(void)

{
  code *pcVar1;
  char *__s;
  AasCreateAccessKeyForAccountRequestType *pAVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1e9;
  int ret;
  HttpTestListener *local_1c8;
  HttpTestListener *listener;
  string local_1b8;
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [55];
  allocator<char> local_131;
  string local_130 [32];
  AasCreateAccessKeyForAccountRequestType *local_110;
  Aas *aas;
  AasCreateAccessKeyForAccountResponseType resp;
  AasCreateAccessKeyForAccountRequestType req;
  
  aliyun::AasCreateAccessKeyForAccountRequestType::AasCreateAccessKeyForAccountRequestType
            ((AasCreateAccessKeyForAccountRequestType *)((long)&resp.pk.field_2 + 8));
  aliyun::AasCreateAccessKeyForAccountResponseType::AasCreateAccessKeyForAccountResponseType
            ((AasCreateAccessKeyForAccountResponseType *)&aas);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"cn-hangzhou",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_168,"my_appid",&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"my_secret",&local_191);
  pAVar2 = (AasCreateAccessKeyForAccountRequestType *)
           aliyun::Aas::CreateAasClient(local_130,local_168,local_190);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  local_110 = pAVar2;
  if (pAVar2 == (AasCreateAccessKeyForAccountRequestType *)0x0) {
    aliyun::AasCreateAccessKeyForAccountResponseType::~AasCreateAccessKeyForAccountResponseType
              ((AasCreateAccessKeyForAccountResponseType *)&aas);
    aliyun::AasCreateAccessKeyForAccountRequestType::~AasCreateAccessKeyForAccountRequestType
              ((AasCreateAccessKeyForAccountRequestType *)((long)&resp.pk.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Aas::SetProxyHost((Aas *)pAVar2,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Aas::SetUseTls((Aas *)local_110,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_create_access_key_for_account_response;
  local_1c8 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1e9);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1e9);
  HttpTestListener::Start(local_1c8);
  std::__cxx11::string::operator=((string *)(resp.pk.field_2._M_local_buf + 8),"PK");
  std::__cxx11::string::operator=((string *)(req.pk.field_2._M_local_buf + 8),"AKSecret");
  aliyun::Aas::CreateAccessKeyForAccount
            (local_110,(AasCreateAccessKeyForAccountResponseType *)((long)&resp.pk.field_2 + 8),
             (AasErrorInfo *)&aas);
  HttpTestListener::WaitComplete(local_1c8);
  pHVar3 = local_1c8;
  if (local_1c8 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_1c8);
    operator_delete(pHVar3,0x180);
  }
  pAVar2 = local_110;
  if (local_110 != (AasCreateAccessKeyForAccountRequestType *)0x0) {
    aliyun::Aas::~Aas((Aas *)local_110);
    operator_delete(pAVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_create_access_key_for_account() {
  AasCreateAccessKeyForAccountRequestType req;
  AasCreateAccessKeyForAccountResponseType resp;
  Aas* aas = Aas::CreateAasClient("cn-hangzhou", "my_appid", "my_secret");
  if(!aas) return 0;
  aas->SetProxyHost("127.0.0.1:12234");
  aas->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_create_access_key_for_account_response);
  listener->Start();
  req.pk = "PK";
  req.ak_secret = "AKSecret";
  int ret = aas->CreateAccessKeyForAccount(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete aas;
}